

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

double log(double __x)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Set<std::shared_ptr<LogOutput>_> *__range1;
  function<void_(const_std::shared_ptr<LogOutput>_&)> *in_RDI;
  double extraout_XMM0_Qa;
  Set<std::shared_ptr<LogOutput>_> logs;
  _Rb_tree<std::shared_ptr<LogOutput>,_std::shared_ptr<LogOutput>,_std::_Identity<std::shared_ptr<LogOutput>_>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
  _Stack_48;
  
  p_Var1 = &_Stack_48._M_impl.super__Rb_tree_header;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::mutex::lock(&sOutputsMutex);
  std::
  _Rb_tree<std::shared_ptr<LogOutput>,_std::shared_ptr<LogOutput>,_std::_Identity<std::shared_ptr<LogOutput>_>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
  ::operator=(&_Stack_48,
              (_Rb_tree<std::shared_ptr<LogOutput>,_std::shared_ptr<LogOutput>,_std::_Identity<std::shared_ptr<LogOutput>_>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
               *)&sOutputs);
  pthread_mutex_unlock((pthread_mutex_t *)&sOutputsMutex);
  for (p_Var2 = _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::function<void_(const_std::shared_ptr<LogOutput>_&)>::operator()
              (in_RDI,(shared_ptr<LogOutput> *)(p_Var2 + 1));
  }
  std::
  _Rb_tree<std::shared_ptr<LogOutput>,_std::shared_ptr<LogOutput>,_std::_Identity<std::shared_ptr<LogOutput>_>,_std::less<std::shared_ptr<LogOutput>_>,_std::allocator<std::shared_ptr<LogOutput>_>_>
  ::~_Rb_tree(&_Stack_48);
  return extraout_XMM0_Qa;
}

Assistant:

void log(const std::function<void(const std::shared_ptr<LogOutput> &)> &func)
{
    Set<std::shared_ptr<LogOutput> > logs;
    {
        std::lock_guard<std::mutex> lock(sOutputsMutex);
        logs = sOutputs;
    }
    for (const auto &out : logs) {
        func(out);
    }
}